

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

TCompareResult __thiscall
Refal2::CArbitraryInteger::compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference puVar6;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  const_reverse_iterator j;
  const_reverse_iterator i;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  if (sVar4 < sVar5) {
    this_local._4_4_ = CR_Less;
  }
  else {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    if (sVar4 < sVar5) {
      this_local._4_4_ = CR_Great;
    }
    else {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
      if (sVar4 != sVar5) {
        __assert_fail("operand.size() == size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x109,
                      "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                     );
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crbegin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crbegin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_38 + 8));
      while( true ) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crend
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
        bVar2 = std::operator!=(&j,(reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)local_38);
        bVar3 = false;
        if (bVar2) {
          puVar6 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator*(&j);
          uVar1 = *puVar6;
          puVar6 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(local_38 + 8));
          bVar3 = uVar1 == *puVar6;
        }
        if (!bVar3) break;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator++(&j);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)(local_38 + 8));
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crend
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_48 + 8));
      bVar3 = std::operator==(&j,(reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)(local_48 + 8));
      if (bVar3) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::crend
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
        bVar3 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)(local_38 + 8),
                                (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)local_48);
        if (!bVar3) {
          __assert_fail("j == operand.crend()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                        ,0x111,
                        "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                       );
        }
        this_local._4_4_ = CR_Equal;
      }
      else {
        puVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator*(&j);
        uVar1 = *puVar6;
        puVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(local_38 + 8));
        if (uVar1 == *puVar6) {
          __assert_fail("*i != *j",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                        ,0x114,
                        "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                       );
        }
        puVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator*(&j);
        uVar1 = *puVar6;
        puVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(local_38 + 8));
        this_local._4_4_ = CR_Great;
        if (uVar1 < *puVar6) {
          this_local._4_4_ = CR_Less;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::compare(
	const CArbitraryInteger& operand ) const
{
	if( size() < operand.size() ) {
		return CR_Less;
	} else if( operand.size() < size() ) {
		return CR_Great;
	} else {
		assert( operand.size() == size() );
		const_reverse_iterator i = crbegin();
		const_reverse_iterator j = operand.crbegin();
		while( i != crend() && *i == *j ) {
			++i;
			++j;
		}
		if( i == crend() ) {
			assert( j == operand.crend() );
			return CR_Equal;
		}
		assert( *i != *j );
		return ( *i < *j ? CR_Less : CR_Great );
	}
}